

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

void __thiscall QAbstractItemView::mouseMoveEvent(QAbstractItemView *this,QMouseEvent *event)

{
  QAbstractItemViewPrivate *this_00;
  QWidget *pQVar1;
  QAbstractItemModel *pQVar2;
  Data *pDVar3;
  int iVar4;
  SelectionFlag SVar5;
  bool bVar6;
  char cVar7;
  LayoutDirection LVar8;
  int iVar9;
  SelectionFlag SVar10;
  QPoint eventPosition;
  ulong uVar11;
  QPoint QVar12;
  QObject *pQVar13;
  QPoint QVar14;
  Representation RVar15;
  Representation RVar16;
  long in_FS_OFFSET;
  double dVar17;
  undefined1 auVar18 [16];
  QPersistentModelIndex index;
  QModelIndex local_a8;
  int local_90;
  int local_8c;
  QPoint local_88;
  QModelIndex local_80;
  QModelIndex local_68;
  QPersistentModelIndex local_48;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  auVar18 = QEventPoint::position();
  dVar17 = (double)((ulong)auVar18._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar18._0_8_;
  bVar6 = 2147483647.0 < dVar17;
  if (dVar17 <= -2147483648.0) {
    dVar17 = -2147483648.0;
  }
  RVar16.m_i = (int)(double)(-(ulong)bVar6 & 0x41dfffffffc00000 | ~-(ulong)bVar6 & (ulong)dVar17);
  dVar17 = (double)((ulong)auVar18._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar18._8_8_;
  bVar6 = 2147483647.0 < dVar17;
  if (dVar17 <= -2147483648.0) {
    dVar17 = -2147483648.0;
  }
  RVar15.m_i = (int)(double)(-(ulong)bVar6 & 0x41dfffffffc00000 | ~-(ulong)bVar6 & (ulong)dVar17);
  eventPosition.yp.m_i = RVar15.m_i;
  eventPosition.xp.m_i = RVar16.m_i;
  pQVar1 = *(QWidget **)
            &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
             field_0x8;
  local_40 = eventPosition;
  LVar8 = QWidget::layoutDirection(pQVar1);
  iVar9 = (**(code **)(*(long *)pQVar1 + 0x2b0))(pQVar1);
  iVar4 = -iVar9;
  if (LVar8 != RightToLeft) {
    iVar4 = iVar9;
  }
  iVar9 = (**(code **)(*(long *)pQVar1 + 0x2b8))(pQVar1);
  QVar12.xp.m_i = iVar4 + RVar16.m_i;
  QVar12.yp.m_i = iVar9 + RVar15.m_i;
  this_00->draggedPosition = QVar12;
  if (1 < *(int *)(*(long *)(this + 8) + 0x3a8) - 4U) {
    if (*(int *)(*(long *)(this + 8) + 0x3a8) == 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QAbstractItemViewPrivate::maybeStartDrag(this_00,eventPosition);
        return;
      }
      goto LAB_0053305d;
    }
    local_48.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*(long *)this + 0x1f0))(&local_68,this,&local_40);
    QPersistentModelIndex::QPersistentModelIndex(&local_48,&local_68);
    local_68.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = this_00->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_80,&this_00->pressedIndex);
    (**(code **)(*(long *)pQVar2 + 0x148))(&local_68,pQVar2,&local_80);
    if ((*(int *)(*(long *)(this + 8) + 0x3a8) != 3) ||
       (bVar6 = QAbstractItemViewPrivate::hasEditor(this_00,&local_68), !bVar6)) {
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_80,&local_48);
      cVar7 = (**(code **)(*(long *)this + 0x2e0))(this,&local_80,0,event);
      if (cVar7 == '\0') {
        QVar14 = local_40;
        if (this_00->selectionMode != SingleSelection) {
          pQVar1 = *(QWidget **)
                    &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                     super_QWidgetPrivate.field_0x8;
          LVar8 = QWidget::layoutDirection(pQVar1);
          iVar9 = (**(code **)(*(long *)pQVar1 + 0x2b0))(pQVar1);
          iVar4 = -iVar9;
          if (LVar8 == RightToLeft) {
            iVar4 = iVar9;
          }
          iVar9 = (**(code **)(*(long *)pQVar1 + 0x2b8))(pQVar1);
          QVar14.xp.m_i = iVar4 + (this_00->pressedPosition).xp.m_i;
          QVar14.yp.m_i = (this_00->pressedPosition).yp.m_i - iVar9;
        }
        QAbstractItemViewPrivate::checkMouseMove(this_00,&local_48);
        cVar7 = QPersistentModelIndex::isValid();
        if ((((cVar7 != '\0') && (this_00->dragEnabled == true)) &&
            (*(int *)(*(long *)(this + 8) + 0x3a8) != 2)) && (*(int *)(event + 0x44) != 0)) {
          QAbstractItemViewPrivate::selectedDraggableIndexes((QModelIndexList *)&local_80,this_00);
          if ((QPoint)local_80._0_8_ != (QPoint)0x0) {
            LOCK();
            *(int *)local_80._0_8_ = *(int *)local_80._0_8_ + -1;
            UNLOCK();
            if (*(int *)local_80._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)local_80._0_8_,0x18,0x10);
            }
          }
          if (local_80.m.ptr != (QAbstractItemModel *)0x0) {
            *(undefined4 *)(*(long *)(this + 8) + 0x3a8) = 1;
            QAbstractItemViewPrivate::maybeStartDrag(this_00,local_40);
            goto LAB_0053302b;
          }
        }
        if (((byte)event[0x44] & 1) != 0) {
          QPersistentModelIndex::operator_cast_to_QModelIndex(&local_80,&local_48);
          cVar7 = (**(code **)(*(long *)&(this_00->super_QAbstractScrollAreaPrivate).
                                         super_QFramePrivate.super_QWidgetPrivate + 0x138))
                            (this_00,&local_80);
          if (((cVar7 != '\0') && (pDVar3 = (this_00->selectionModel).wp.d, pDVar3 != (Data *)0x0))
             && ((*(int *)(pDVar3 + 4) != 0 &&
                 ((this_00->selectionModel).wp.value != (QObject *)0x0)))) {
            *(undefined4 *)(*(long *)(this + 8) + 0x3a8) = 2;
            QPersistentModelIndex::operator_cast_to_QModelIndex(&local_80,&local_48);
            SVar10 = (**(code **)(*(long *)this + 0x2e8))(this,&local_80,event);
            SVar5 = SVar10 & ~Toggle | this_00->ctrlDragSelectionFlag;
            if ((SVar10 & Toggle) == NoUpdate) {
              SVar5 = SVar10;
            }
            if (this_00->ctrlDragSelectionFlag == NoUpdate) {
              SVar5 = SVar10;
            }
            local_90 = (int)QVar14.xp.m_i;
            local_8c = (int)QVar14.yp.m_i;
            local_88 = local_40;
            (**(code **)(*(long *)this + 0x2c8))(this,&local_90,SVar5);
            cVar7 = QPersistentModelIndex::isValid();
            if (cVar7 != '\0') {
              QItemSelectionModel::currentIndex();
              cVar7 = comparesEqual(&local_48,&local_80);
              if (cVar7 == '\0') {
                QPersistentModelIndex::operator_cast_to_QModelIndex(&local_a8,&local_48);
                uVar11 = (**(code **)(*(long *)this_00->model + 0x138))(this_00->model,&local_a8);
                if ((uVar11 & 0x20) != 0) {
                  pDVar3 = (this_00->selectionModel).wp.d;
                  if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
                    pQVar13 = (QObject *)0x0;
                  }
                  else {
                    pQVar13 = (this_00->selectionModel).wp.value;
                  }
                  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_80,&local_48);
                  (**(code **)(*(long *)pQVar13 + 0x60))(pQVar13,&local_80,0);
                  goto LAB_0053302b;
                }
              }
            }
            local_80._0_8_ = QMouseEvent::pos(event);
            bVar6 = QAbstractItemViewPrivate::shouldAutoScroll(this_00,(QPoint *)&local_80);
            if ((bVar6) && ((this_00->autoScrollTimer).m_id == Invalid)) {
              startAutoScroll(this);
            }
          }
        }
      }
    }
LAB_0053302b:
    QPersistentModelIndex::~QPersistentModelIndex(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0053305d:
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::mouseMoveEvent(QMouseEvent *event)
{
    Q_D(QAbstractItemView);
    QPoint bottomRight = event->position().toPoint();

    d->draggedPosition = bottomRight + d->offset();

    if (state() == ExpandingState || state() == CollapsingState)
        return;

#if QT_CONFIG(draganddrop)
    if (state() == DraggingState) {
        d->maybeStartDrag(bottomRight);
        return;
    }
#endif // QT_CONFIG(draganddrop)

    QPersistentModelIndex index = indexAt(bottomRight);
    QModelIndex buddy = d->model->buddy(d->pressedIndex);
    if ((state() == EditingState && d->hasEditor(buddy))
        || edit(index, NoEditTriggers, event))
        return;

    const QPoint topLeft =
            d->selectionMode != SingleSelection ? d->pressedPosition - d->offset() : bottomRight;

    d->checkMouseMove(index);

#if QT_CONFIG(draganddrop)
    if (d->pressedIndex.isValid()
        && d->dragEnabled
        && (state() != DragSelectingState)
        && (event->buttons() != Qt::NoButton)
        && !d->selectedDraggableIndexes().isEmpty()) {
            setState(DraggingState);
            d->maybeStartDrag(bottomRight);
            return;
    }
#endif

    if ((event->buttons() & Qt::LeftButton) && d->selectionAllowed(index) && d->selectionModel) {
        setState(DragSelectingState);
        QItemSelectionModel::SelectionFlags command = selectionCommand(index, event);
        if (d->ctrlDragSelectionFlag != QItemSelectionModel::NoUpdate && command.testFlag(QItemSelectionModel::Toggle)) {
            command &= ~QItemSelectionModel::Toggle;
            command |= d->ctrlDragSelectionFlag;
        }

        // Do the normalize ourselves, since QRect::normalized() is flawed
        QRect selectionRect = QRect(topLeft, bottomRight);
        setSelection(selectionRect, command);

        // set at the end because it might scroll the view
        if (index.isValid() && (index != d->selectionModel->currentIndex()) && d->isIndexEnabled(index))
            d->selectionModel->setCurrentIndex(index, QItemSelectionModel::NoUpdate);
        else if (d->shouldAutoScroll(event->pos()) && !d->autoScrollTimer.isActive())
            startAutoScroll();
    }
}